

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::async_read_some(http *this,void *p,size_t s,io_handler *h)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference __src;
  ulong uVar4;
  callback *pcVar5;
  error_code *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  vector<char,_std::allocator<char>_> v;
  http *in_stack_ffffffffffffff40;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  callback local_78 [72];
  undefined1 local_30 [16];
  error_code *local_20;
  ulong local_18;
  void *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  update_time(in_stack_ffffffffffffff40);
  uVar1 = *(uint *)((long)in_RDI + 0x148);
  sVar3 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x130));
  if (uVar1 == sVar3) {
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x499363)
    ;
    *(undefined4 *)((long)in_RDI + 0x148) = 0;
  }
  bVar2 = std::vector<char,_std::allocator<char>_>::empty(in_stack_ffffffffffffff50);
  if (bVar2) {
    sVar3 = std::vector<char,_std::allocator<char>_>::capacity
                      ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x130));
    if (sVar3 != 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x4994f1);
      std::vector<char,_std::allocator<char>_>::swap
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff50);
    }
    pcVar5 = local_78;
    booster::aio::buffer(in_RDI,in_stack_ffffffffffffff60);
    booster::aio::stream_socket::async_read_some((mutable_buffer *)((long)in_RDI + 0x100),pcVar5);
    booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x499567);
  }
  else {
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x130));
    if (sVar3 - *(uint *)((long)in_RDI + 0x148) < local_18) {
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x130));
      local_18 = sVar3 - *(uint *)((long)in_RDI + 0x148);
    }
    __src = std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x130),
                       (ulong)*(uint *)((long)in_RDI + 0x148));
    memcpy(local_10,__src,local_18);
    *(int *)((long)in_RDI + 0x148) = *(int *)((long)in_RDI + 0x148) + (int)local_18;
    uVar4 = (ulong)*(uint *)((long)in_RDI + 0x148);
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x130));
    if (uVar4 == sVar3) {
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0x49946a);
      *(undefined4 *)((long)in_RDI + 0x148) = 0;
    }
    pcVar5 = (callback *)booster::aio::basic_io_device::get_io_service();
    std::error_code::error_code((error_code *)in_stack_ffffffffffffff40);
    booster::aio::io_service::post(pcVar5,local_20,(ulong)local_30);
  }
  return;
}

Assistant:

virtual void async_read_some(void *p,size_t s,io_handler const &h)
		{
			update_time();
			if(input_body_ptr_==input_body_.size()) {
				input_body_.clear();
				input_body_ptr_=0;
			}
			if(!input_body_.empty()) {
				if(input_body_.size() - input_body_ptr_ < s) {
					s=input_body_.size() -  input_body_ptr_;
				}
				memcpy(p,&input_body_[input_body_ptr_],s);
				input_body_ptr_+=s;
				if(input_body_ptr_==input_body_.size()) {
					input_body_.clear();
					input_body_ptr_=0;
				}
				socket_.get_io_service().post(h,booster::system::error_code(),s);
				return;
			}
			if(input_body_.capacity()!=0) {
				std::vector<char> v;
				input_body_.swap(v);
			}
			socket_.async_read_some(io::buffer(p,s),h);
		}